

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int pull_elements_confidential
              (uchar **cursor,size_t *max,uchar **value,size_t *val_len,size_t prefixA,
              size_t prefixB,size_t prefixed_size,size_t explicit_size)

{
  byte bVar1;
  uchar *puVar2;
  size_t local_50;
  size_t size;
  uint8_t type;
  size_t prefixB_local;
  size_t prefixA_local;
  size_t *val_len_local;
  uchar **value_local;
  size_t *max_local;
  uchar **cursor_local;
  
  bVar1 = peek_u8(cursor,max);
  if (bVar1 == 0) {
    pull_u8(cursor,max);
    *value = (uchar *)0x0;
    *val_len = 0;
    cursor_local._4_4_ = 0;
  }
  else {
    if (bVar1 == 1) {
      local_50 = explicit_size;
    }
    else {
      if ((bVar1 != prefixA) && (bVar1 != prefixB)) {
        return -2;
      }
      local_50 = prefixed_size;
    }
    puVar2 = pull_skip(cursor,max,local_50);
    *value = puVar2;
    if (*cursor == (uchar *)0x0) {
      cursor_local._4_4_ = -2;
    }
    else {
      *val_len = local_50;
      cursor_local._4_4_ = 0;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

static int pull_elements_confidential(const unsigned char **cursor, size_t *max,
                                      const unsigned char **value, size_t *val_len,
                                      size_t prefixA, size_t prefixB,
                                      size_t prefixed_size, size_t explicit_size)
{
    /* First byte is always the 'version' which tells you what the value is */
    const uint8_t type = peek_u8(cursor, max);
    size_t size;

    if (type == 0) {
        /* Empty, Pop off the type */
        pull_u8(cursor, max);
        *value = NULL;
        *val_len = 0;
        return WALLY_OK;
    }

    if (type == 1)
        size = explicit_size;
    else if (type == prefixA || type == prefixB)
        size = prefixed_size;
    else
        return WALLY_EINVAL;

    *value = pull_skip(cursor, max, size);
    if (!*cursor)
        return WALLY_EINVAL;
    *val_len = size;
    return WALLY_OK;
}